

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall
ON_Brep::IsCorrupt(ON_Brep *this,bool bRepair,bool bSilentError,ON_TextLog *text_log)

{
  uint max_idx;
  ON_BrepEdge *pOVar1;
  ON_BrepTrim *pOVar2;
  ON_BrepLoop *pOVar3;
  ON_BrepFace *pOVar4;
  ulong uVar5;
  ON_BrepEdge *pOVar6;
  int iVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  int *piVar9;
  int max_idx_00;
  undefined7 in_register_00000031;
  ON_BrepVertex *pOVar10;
  long lVar11;
  ulong text_log_ptr_plus;
  bool bCorrupt;
  ON_Brep *ignored_this_ptr;
  bool local_91;
  ulong local_90;
  ON_BrepLoop *local_88;
  ON_BrepFace *local_80;
  ON_BrepVertex *local_78;
  ulong local_70;
  ulong local_68;
  ON_Brep *local_60;
  ulong local_58;
  int local_4c;
  int local_48;
  int local_44;
  ON_BrepEdge *local_40;
  ON_Brep *local_38;
  
  local_91 = false;
  local_48 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_4c = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_44 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
  local_70 = (ulong)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                    super_ON_ClassArray<ON_BrepVertex>.m_count;
  uVar8 = CONCAT71(in_register_00000011,bSilentError) & 0xffffffff | (ulong)text_log;
  text_log_ptr_plus = uVar8 | 2;
  if ((int)CONCAT71(in_register_00000031,bRepair) == 0) {
    text_log_ptr_plus = uVar8;
  }
  max_idx = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  local_88 = (ON_BrepLoop *)(ulong)max_idx;
  local_80 = (ON_BrepFace *)
             (ulong)(uint)(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_count;
  local_68 = (ulong)(uint)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                          super_ON_ClassArray<ON_BrepLoop>.m_count;
  local_58 = (ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                          super_ON_ClassArray<ON_BrepFace>.m_count;
  local_60 = this;
  local_38 = this;
  if (0 < (long)local_70) {
    uVar8 = 0;
    do {
      pOVar10 = (local_60->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                super_ON_ClassArray<ON_BrepVertex>.m_a;
      local_90 = uVar8;
      local_78 = pOVar10;
      Internal_ValidateBrepComponentBackPtr
                (text_log_ptr_plus,L"Corrupt ON_BrepVertex.m_vertex_index back pointer.\n",&local_91
                 ,local_60,&local_38,(int)uVar8,&pOVar10[uVar8].m_vertex_index);
      lVar11 = (long)pOVar10[uVar8].m_ei.m_count;
      if (0 < lVar11) {
        piVar9 = local_78[uVar8].m_ei.m_a;
        do {
          Internal_ValidateBrepIndex
                    (text_log_ptr_plus,L"Corrupt ON_BrepVertex.m_ei[] index.\n",&local_91,max_idx,
                     piVar9);
          piVar9 = piVar9 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      uVar8 = local_90 + 1;
    } while (uVar8 != local_70);
  }
  max_idx_00 = (int)local_70;
  if (0 < (int)local_88) {
    uVar8 = 0x54;
    pOVar10 = (ON_BrepVertex *)0x0;
    do {
      uVar5 = local_70;
      pOVar1 = (local_60->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
               m_a;
      local_40 = pOVar1 + (long)pOVar10;
      local_78 = pOVar10;
      Internal_ValidateBrepComponentBackPtr
                (text_log_ptr_plus,L"Corrupt ON_BrepEdge m_brep or m_edge_index back pointers.\n",
                 &local_91,local_60,&local_40->m_brep,(int)pOVar10,
                 &pOVar1[(long)pOVar10].m_edge_index);
      lVar11 = 0;
      local_90 = uVar8;
      do {
        Internal_ValidateBrepIndex
                  (text_log_ptr_plus,L"Corrupt ON_BrepEdge.m_vi[] index.\n",&local_91,(int)uVar5,
                   (int *)((long)&(((ON_CurveProxy *)
                                   (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                  super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          + lVar11 + uVar8));
        pOVar6 = local_40;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 8);
      Internal_ValidateBrepIndex
                (text_log_ptr_plus,L"Corrupt ON_BrepEdge.m_c3i index.\n",&local_91,local_4c,
                 &local_40->m_c3i);
      pOVar4 = local_80;
      lVar11 = (long)(pOVar6->m_ti).m_count;
      if (0 < lVar11) {
        piVar9 = (pOVar6->m_ti).m_a;
        do {
          Internal_ValidateBrepIndex
                    (text_log_ptr_plus,L"Corrupt ON_BrepEdge.m_ti[] index.\n",&local_91,(int)pOVar4,
                     piVar9);
          piVar9 = piVar9 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pOVar10 = (ON_BrepVertex *)
                ((long)&(local_78->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                + 1);
      uVar8 = local_90 + 0x88;
      max_idx_00 = (int)local_70;
    } while ((ON_BrepLoop *)pOVar10 != local_88);
  }
  iVar7 = (int)local_68;
  if (0 < (int)local_80) {
    local_90 = 0x58;
    pOVar10 = (ON_BrepVertex *)0x0;
    do {
      pOVar2 = (local_60->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
               m_a;
      local_78 = pOVar10;
      Internal_ValidateBrepComponentBackPtr
                (text_log_ptr_plus,L"Corrupt ON_BrepTrim m_brep or m_trim_index back pointers.\n",
                 &local_91,local_60,&pOVar2[(long)pOVar10].m_brep,(int)pOVar10,
                 &pOVar2[(long)pOVar10].m_trim_index);
      Internal_ValidateBrepIndex
                (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_c2i index.\n",&local_91,local_48,
                 &pOVar2[(long)pOVar10].m_c2i);
      Internal_ValidateBrepIndex
                (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_ei index.\n",&local_91,(int)local_88,
                 &pOVar2[(long)pOVar10].m_ei);
      Internal_ValidateBrepIndex
                (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_li index.\n",&local_91,(int)local_68,
                 &pOVar2[(long)pOVar10].m_li);
      uVar8 = local_90;
      lVar11 = 0;
      do {
        Internal_ValidateBrepIndex
                  (text_log_ptr_plus,L"Corrupt ON_BrepTrim.m_vi[] index.\n",&local_91,max_idx_00,
                   (int *)((long)&(((ON_CurveProxy *)
                                   (&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                  super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          + lVar11 + uVar8));
        lVar11 = lVar11 + 4;
      } while (lVar11 != 8);
      pOVar10 = (ON_BrepVertex *)
                ((long)&(local_78->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                + 1);
      local_90 = local_90 + 0xe8;
      iVar7 = (int)local_68;
    } while ((ON_BrepFace *)pOVar10 != local_80);
  }
  pOVar4 = local_80;
  if (0 < iVar7) {
    uVar8 = 0;
    do {
      local_88 = (local_60->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                 m_a;
      local_90 = uVar8 * 0x78;
      pOVar3 = local_88 + uVar8;
      local_70 = uVar8;
      Internal_ValidateBrepComponentBackPtr
                (text_log_ptr_plus,L"Corrupt ON_BrepLoop m_brep or m_loop_index back pointers.\n",
                 &local_91,local_60,&local_88[uVar8].m_brep,(int)uVar8,&pOVar3->m_loop_index);
      lVar11 = (long)(&pOVar3->m_loop_index)[5];
      if (0 < lVar11) {
        piVar9 = *(int **)((long)&(local_88->m_ti).m_a + local_90);
        do {
          Internal_ValidateBrepIndex
                    (text_log_ptr_plus,L"Corrupt ON_BrepLoop.m_ti[] index.\n",&local_91,(int)pOVar4,
                     piVar9);
          piVar9 = piVar9 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      Internal_ValidateBrepIndex
                (text_log_ptr_plus,L"Corrupt ON_BrepLoop.m_fi index.\n",&local_91,(int)local_58,
                 (int *)((long)&local_88->m_fi + local_90));
      uVar8 = local_70 + 1;
    } while (uVar8 != local_68);
  }
  uVar8 = local_68;
  if (0 < (int)local_58) {
    local_90 = 0;
    do {
      local_80 = (local_60->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                 m_a;
      local_88 = (ON_BrepLoop *)(local_90 * 0xd8);
      pOVar4 = local_80 + local_90;
      Internal_ValidateBrepComponentBackPtr
                (text_log_ptr_plus,L"Corrupt ON_BrepFace m_brep or m_face_index back pointers.\n",
                 &local_91,local_60,&local_80[local_90].m_brep,(int)local_90,&pOVar4->m_face_index);
      lVar11 = (long)(&pOVar4->m_face_index)[5];
      if (0 < lVar11) {
        piVar9 = *(int **)((local_80->m_face_uuid).Data4 + (long)local_88 + -0x24);
        do {
          Internal_ValidateBrepIndex
                    (text_log_ptr_plus,L"Corrupt ON_BrepFace.m_li[] index.\n",&local_91,(int)uVar8,
                     piVar9);
          piVar9 = piVar9 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      Internal_ValidateBrepIndex
                (text_log_ptr_plus,L"Corrupt ON_BrepFace.m_si index.\n",&local_91,local_44,
                 (int *)((local_80->m_face_uuid).Data4 + (long)local_88 + -0x14));
      local_90 = local_90 + 1;
    } while (local_90 != local_58);
  }
  return local_91;
}

Assistant:

bool ON_Brep::IsCorrupt(
  bool bRepair,
  bool bSilentError,
  class ON_TextLog* text_log
) const
{
  bool bCorrupt = false;

  const int C2_count = m_C2.Count();
  const int C3_count = m_C3.Count();
  const int S_count = m_S.Count();
  const int V_count = m_V.Count();
  const int E_count = m_E.Count();
  const int T_count = m_T.Count();
  const int L_count = m_L.Count();
  const int F_count = m_F.Count();

  ON__UINT_PTR text_log_ptr = (ON__UINT_PTR)text_log;
  if (bSilentError)
    text_log_ptr |= 1;
  if (bRepair)
    text_log_ptr |= 2;

  ON_Brep* ignored_this_ptr = const_cast<ON_Brep*>(this);

  for (int vi = 0; vi < V_count; vi++)
  {
    const ON_BrepVertex& v = m_V[vi];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepVertex.m_vertex_index back pointer.\n",
      bCorrupt,
      this, &ignored_this_ptr,
      vi, v.m_vertex_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepVertex.m_ei[] index.\n",
      bCorrupt,
      E_count,
      v.m_ei
    );
  }
  
  for (int ei = 0; ei < E_count; ei++)
  {
    const ON_BrepEdge& e = m_E[ei];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepEdge m_brep or m_edge_index back pointers.\n",
      bCorrupt,
      this, &e.m_brep,
      ei, e.m_edge_index
    );

    Internal_ValidateBrepIndexArray(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_vi[] index.\n",
      bCorrupt,
      V_count,
      2,
      e.m_vi
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_c3i index.\n",
      bCorrupt,
      C3_count,
      e.m_c3i
    );
    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_ti[] index.\n",
      bCorrupt,
      T_count,
      e.m_ti
    );
  }
  
  for (int ti = 0; ti < T_count; ti++)
  {
    const ON_BrepTrim& t = m_T[ti];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepTrim m_brep or m_trim_index back pointers.\n",
      bCorrupt,
      this, &t.m_brep,
      ti, t.m_trim_index
    );

    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_c2i index.\n",
      bCorrupt,
      C2_count,
      t.m_c2i
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_ei index.\n",
      bCorrupt,
      E_count,
      t.m_ei
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_li index.\n",
      bCorrupt,
      L_count,
      t.m_li
    );
    Internal_ValidateBrepIndexArray(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_vi[] index.\n",
      bCorrupt,
      V_count,
      2,
      t.m_vi
    );
  }
  
  for (int li = 0; li < L_count; li++)
  {
    const ON_BrepLoop& l = m_L[li];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepLoop m_brep or m_loop_index back pointers.\n",
      bCorrupt,
      this, &l.m_brep,
      li, l.m_loop_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepLoop.m_ti[] index.\n",
      bCorrupt,
      T_count,
      l.m_ti
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepLoop.m_fi index.\n",
      bCorrupt,
      F_count,
      l.m_fi
    );
  }
  
  for (int fi = 0; fi < F_count; fi++)
  {
    const ON_BrepFace& f = m_F[fi];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepFace m_brep or m_face_index back pointers.\n",
      bCorrupt,
      this, &f.m_brep,
      fi, f.m_face_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepFace.m_li[] index.\n",
      bCorrupt,
      L_count,
      f.m_li
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepFace.m_si index.\n",
      bCorrupt,
      S_count,
      f.m_si
    );
  }

  return bCorrupt;
}